

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeIndirectComputeDispatchTests.cpp
# Opt level: O3

void __thiscall
vkt::compute::anon_unknown_1::IndirectDispatchCaseBufferUpload::initPrograms
          (IndirectDispatchCaseBufferUpload *this,SourceCollections *programCollection)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *__s;
  size_t sVar3;
  mapped_type *pmVar4;
  long *plVar5;
  ProgramSources *pPVar6;
  size_type *psVar7;
  string verifyProgramString;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  ostringstream s;
  ostringstream verifyBuffer;
  string local_3a8;
  string local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_348;
  undefined1 local_318 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308 [6];
  ios_base local_2a8 [264];
  long local_1a0 [14];
  ios_base local_130 [264];
  
  __s = glu::getGLSLVersionDeclaration(this->m_glslVersion);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  if (__s == (char *)0x0) {
    std::ios::clear((int)&local_3a8 + (int)*(undefined8 *)(local_1a0[0] + -0x18) + 0x208);
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "layout(local_size_x = ${LOCAL_SIZE_X}, local_size_y = ${LOCAL_SIZE_Y}, local_size_z = ${LOCAL_SIZE_Z}) in;\n"
             ,0x6b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"layout(set = 0, binding = 0, std430) buffer Result\n",0x33);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"    uvec3           expectedGroupCount;\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"    coherent uint   numPassed;\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"} result;\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "    if (all(equal(result.expectedGroupCount, gl_NumWorkGroups)))\n",0x41);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"        atomicAdd(result.numPassed, 1u);\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"}\n",2);
  local_348._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_348._M_impl.super__Rb_tree_header._M_header;
  local_348._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_348._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_348._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_348._M_impl.super__Rb_tree_header._M_header._M_right =
       local_348._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
  std::ostream::_M_insert<unsigned_long>((ulong)local_318);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
  std::ios_base::~ios_base(local_2a8);
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"LOCAL_SIZE_X","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_348,(key_type *)local_318);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_3a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,local_308[0]._M_allocated_capacity + 1);
  }
  paVar1 = &local_3a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
  std::ostream::_M_insert<unsigned_long>((ulong)local_318);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
  std::ios_base::~ios_base(local_2a8);
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"LOCAL_SIZE_Y","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_348,(key_type *)local_318);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_3a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,local_308[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
  std::ostream::_M_insert<unsigned_long>((ulong)local_318);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
  std::ios_base::~ios_base(local_2a8);
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"LOCAL_SIZE_Z","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_348,(key_type *)local_318);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_3a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,local_308[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_318,&local_388);
  tcu::StringTemplate::specialize
            (&local_3a8,(StringTemplate *)local_318,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_348);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_318);
  paVar2 = &local_388.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_368,"indirect_dispatch_",
                 &(this->super_TestCase).super_TestCase.super_TestNode.m_name);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_368);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_388.field_2._M_allocated_capacity = *psVar7;
    local_388.field_2._8_8_ = plVar5[3];
    local_388._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_388.field_2._M_allocated_capacity = *psVar7;
    local_388._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_388._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_388);
  local_318._0_4_ = 5;
  local_318._8_8_ = local_308[0]._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_318 + 8),local_3a8._M_dataplus._M_p,
             local_3a8._M_dataplus._M_p + local_3a8._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar6->sources + (local_318._0_8_ & 0xffffffff),(value_type *)(local_318 + 8));
  if ((char *)local_318._8_8_ != local_308[0]._M_local_buf + 8) {
    operator_delete((void *)local_318._8_8_,local_308[0]._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_348);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void IndirectDispatchCaseBufferUpload::initPrograms (vk::SourceCollections& programCollection) const
{
	const char* const	versionDecl = glu::getGLSLVersionDeclaration(m_glslVersion);

	std::ostringstream	verifyBuffer;

	verifyBuffer
		<< versionDecl << "\n"
		<< "layout(local_size_x = ${LOCAL_SIZE_X}, local_size_y = ${LOCAL_SIZE_Y}, local_size_z = ${LOCAL_SIZE_Z}) in;\n"
		<< "layout(set = 0, binding = 0, std430) buffer Result\n"
		<< "{\n"
		<< "    uvec3           expectedGroupCount;\n"
		<< "    coherent uint   numPassed;\n"
		<< "} result;\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "    if (all(equal(result.expectedGroupCount, gl_NumWorkGroups)))\n"
		<< "        atomicAdd(result.numPassed, 1u);\n"
		<< "}\n";

	std::map<std::string, std::string> args;

	args["LOCAL_SIZE_X"] = de::toString(m_workGroupSize.x());
	args["LOCAL_SIZE_Y"] = de::toString(m_workGroupSize.y());
	args["LOCAL_SIZE_Z"] = de::toString(m_workGroupSize.z());

	std::string verifyProgramString = tcu::StringTemplate(verifyBuffer.str()).specialize(args);

	programCollection.glslSources.add("indirect_dispatch_" + m_name + "_verify") << glu::ComputeSource(verifyProgramString);
}